

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteDescriptor
          (ReflectionClassGenerator *this,Printer *printer)

{
  FileDescriptor *pFVar1;
  ulong uVar2;
  FileDescriptor *descriptor;
  EnumDescriptor *extraout_RDX;
  EnumDescriptor *extraout_RDX_00;
  EnumDescriptor *extraout_RDX_01;
  EnumDescriptor *descriptor_00;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *descriptor_01;
  int i;
  char *text;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auStack_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  undefined1 local_78 [8];
  string base64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  io::Printer::Print<char[10],std::__cxx11::string,char[22],std::__cxx11::string>
            (printer,
             "#region Descriptor\n/// <summary>File descriptor for $file_name$</summary>\npublic static pbr::FileDescriptor Descriptor {\n  get { return descriptor; }\n}\nprivate static pbr::FileDescriptor descriptor;\n\nstatic $reflection_class_name$() {\n"
             ,(char (*) [10])"file_name",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this->file_,
             (char (*) [22])0x2a4e86,&this->reflectionClassname_);
  google::protobuf::io::Printer::Indent();
  io::Printer::Print<>(printer,"byte[] descriptorData = global::System.Convert.FromBase64String(\n")
  ;
  google::protobuf::io::Printer::Indent();
  google::protobuf::io::Printer::Indent();
  io::Printer::Print<>(printer,"string.Concat(\n");
  google::protobuf::io::Printer::Indent();
  FileDescriptorToBase64_abi_cxx11_((string *)local_78,(csharp *)this->file_,descriptor);
  if ((pointer)0x3c < base64._M_dataplus._M_p) {
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)local_78);
      io::Printer::Print<char[7],std::__cxx11::string>
                (printer,"\"$base64$\",\n",(char (*) [7])"base64",&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)local_78);
      std::__cxx11::string::operator=((string *)local_78,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    } while ((pointer)0x3c < base64._M_dataplus._M_p);
  }
  io::Printer::Print<char[7],std::__cxx11::string>
            (printer,"\"$base64$\"));\n",(char (*) [7])"base64",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>
            (printer,"descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n");
  io::Printer::Print<>(printer,"    new pbr::FileDescriptor[] { ");
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x20)) {
    iVar4 = 0;
    do {
      auVar7 = google::protobuf::FileDescriptor::dependency((int)pFVar1);
      GetReflectionClassName_abi_cxx11_(&local_50,auVar7._0_8_,auVar7._8_8_);
      io::Printer::Print<char[27],std::__cxx11::string>
                (printer,"$full_reflection_class_name$.Descriptor, ",
                 (char (*) [27])"full_reflection_class_name",&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      iVar4 = iVar4 + 1;
      pFVar1 = this->file_;
    } while (iVar4 < *(int *)(pFVar1 + 0x20));
  }
  io::Printer::Print<>(printer,"},\n    new pbr::GeneratedClrTypeInfo(");
  if (*(int *)(this->file_ + 0x30) < 1) {
    text = "null, ";
  }
  else {
    io::Printer::Print<>(printer,"new[] {");
    pFVar1 = this->file_;
    text = "}, ";
    if (0 < *(int *)(pFVar1 + 0x30)) {
      lVar3 = 0;
      lVar5 = 0;
      descriptor_00 = extraout_RDX;
      do {
        GetClassName_abi_cxx11_
                  (&local_50,(csharp *)(*(long *)(pFVar1 + 0x70) + lVar3),descriptor_00);
        io::Printer::Print<char[10],std::__cxx11::string>
                  (printer,"typeof($type_name$), ",(char (*) [10])0x2a17d8,&local_50);
        descriptor_00 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
          descriptor_00 = extraout_RDX_01;
        }
        lVar5 = lVar5 + 1;
        pFVar1 = this->file_;
        lVar3 = lVar3 + 0x50;
      } while (lVar5 < *(int *)(pFVar1 + 0x30));
      text = "}, ";
    }
  }
  io::Printer::Print<>(printer,text);
  pFVar1 = this->file_;
  if (*(int *)(pFVar1 + 0x38) < 1) {
    io::Printer::Print<>(printer,"null, ");
  }
  else {
    auStack_98 = (undefined1  [8])0x0;
    extensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar5 = 0;
    lVar3 = 0;
    descriptor_01 = extraout_RDX_02;
    base64.field_2._8_8_ = printer;
    do {
      GetFullExtensionName_abi_cxx11_
                (&local_50,(csharp *)(*(long *)(pFVar1 + 0x80) + lVar5),descriptor_01);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_98,
                 &local_50);
      descriptor_01 = extraout_RDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
        descriptor_01 = extraout_RDX_04;
      }
      lVar3 = lVar3 + 1;
      pFVar1 = this->file_;
      lVar5 = lVar5 + 0x98;
    } while (lVar3 < *(int *)(pFVar1 + 0x38));
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_50,(protobuf *)auStack_98,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x2b3e82,(char *)(long)*(int *)(pFVar1 + 0x38));
    printer = (Printer *)base64.field_2._8_8_;
    io::Printer::Print<char[11],std::__cxx11::string>
              ((Printer *)base64.field_2._8_8_,"new pb::Extension[] { $extensions$ }, ",
               (char (*) [11])0x2c9ba8,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_98);
  }
  if (*(int *)(this->file_ + 0x2c) < 1) {
    io::Printer::Print<>(printer,"null));\n");
  }
  else {
    io::Printer::Print<>(printer,"new pbr::GeneratedClrTypeInfo[] {\n");
    google::protobuf::io::Printer::Indent();
    google::protobuf::io::Printer::Indent();
    google::protobuf::io::Printer::Indent();
    pFVar1 = this->file_;
    uVar2 = (ulong)*(uint *)(pFVar1 + 0x2c);
    if (0 < (int)*(uint *)(pFVar1 + 0x2c)) {
      lVar3 = 0;
      uVar6 = 0;
      do {
        WriteGeneratedCodeInfo
                  (this,(Descriptor *)(*(long *)(pFVar1 + 0x68) + lVar3),printer,
                   uVar6 == (int)uVar2 - 1);
        uVar6 = uVar6 + 1;
        pFVar1 = this->file_;
        uVar2 = (ulong)*(int *)(pFVar1 + 0x2c);
        lVar3 = lVar3 + 0x90;
      } while ((long)uVar6 < (long)uVar2);
    }
    google::protobuf::io::Printer::Outdent();
    io::Printer::Print<>(printer,"\n}));\n");
    google::protobuf::io::Printer::Outdent();
    google::protobuf::io::Printer::Outdent();
  }
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>(printer,"}\n");
  io::Printer::Print<>(printer,"#endregion\n\n");
  if (local_78 != (undefined1  [8])&base64._M_string_length) {
    operator_delete((void *)local_78);
  }
  return;
}

Assistant:

void ReflectionClassGenerator::WriteDescriptor(io::Printer* printer) {
  printer->Print(
    "#region Descriptor\n"
    "/// <summary>File descriptor for $file_name$</summary>\n"
    "public static pbr::FileDescriptor Descriptor {\n"
    "  get { return descriptor; }\n"
    "}\n"
    "private static pbr::FileDescriptor descriptor;\n"
    "\n"
    "static $reflection_class_name$() {\n",
    "file_name", file_->name(),
    "reflection_class_name", reflectionClassname_);
  printer->Indent();
  printer->Print(
    "byte[] descriptorData = global::System.Convert.FromBase64String(\n");
  printer->Indent();
  printer->Indent();
  printer->Print("string.Concat(\n");
  printer->Indent();

  // TODO(jonskeet): Consider a C#-escaping format here instead of just Base64.
  std::string base64 = FileDescriptorToBase64(file_);
  while (base64.size() > 60) {
    printer->Print("\"$base64$\",\n", "base64", base64.substr(0, 60));
    base64 = base64.substr(60);
  }
  printer->Print("\"$base64$\"));\n", "base64", base64);
  printer->Outdent();
  printer->Outdent();
  printer->Outdent();

  // -----------------------------------------------------------------
  // Invoke InternalBuildGeneratedFileFrom() to build the file.
  printer->Print(
      "descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n");
  printer->Print("    new pbr::FileDescriptor[] { ");
  for (int i = 0; i < file_->dependency_count(); i++) {
      printer->Print(
      "$full_reflection_class_name$.Descriptor, ",
      "full_reflection_class_name",
      GetReflectionClassName(file_->dependency(i)));
  }
  printer->Print("},\n"
      "    new pbr::GeneratedClrTypeInfo(");
  // Specify all the generated code information, recursively.
  if (file_->enum_type_count() > 0) {
      printer->Print("new[] {");
      for (int i = 0; i < file_->enum_type_count(); i++) {
          printer->Print("typeof($type_name$), ", "type_name", GetClassName(file_->enum_type(i)));
      }
      printer->Print("}, ");
  }
  else {
      printer->Print("null, ");
  }  
  if (file_->extension_count() > 0) {
    std::vector<std::string> extensions;
    for (int i = 0; i < file_->extension_count(); i++) {
      extensions.push_back(GetFullExtensionName(file_->extension(i)));
    }
    printer->Print("new pb::Extension[] { $extensions$ }, ", "extensions", Join(extensions, ", "));
  }
  else {
    printer->Print("null, ");
  }
  if (file_->message_type_count() > 0) {
      printer->Print("new pbr::GeneratedClrTypeInfo[] {\n");
      printer->Indent();
      printer->Indent();
      printer->Indent();
      for (int i = 0; i < file_->message_type_count(); i++) {
          WriteGeneratedCodeInfo(file_->message_type(i), printer, i == file_->message_type_count() - 1);
      }
      printer->Outdent();
      printer->Print("\n}));\n");
      printer->Outdent();
      printer->Outdent();
  }
  else {
      printer->Print("null));\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("#endregion\n\n");
}